

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactRMatrixLimitedUncertainties.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::
CompactRMatrixLimitedUncertainties
          (CompactRMatrixLimitedUncertainties *this,CompactRMatrixLimitedUncertainties *param_1)

{
  pointer pSVar1;
  
  ListRecord::ListRecord((ListRecord *)this,(ListRecord *)param_1);
  pSVar1 = (param_1->spin_groups_).
           super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->spin_groups_).
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->spin_groups_).
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT CompactRMatrixLimitedUncertainties {

public:

  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ParticlePairs.hpp"
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceChannels.hpp"
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp"
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/SpinGroup.hpp"

private:

  /* fields */
  ParticlePairs particle_pairs_;
  std::vector< SpinGroup > spin_groups_;

  /* auxiliary functions */
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/src/verifySize.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the number of spin groups
   */
  unsigned int NJSX() const { return this->spin_groups_.size(); }

  /**
   *  @brief Return the number of spin groups
   */
  unsigned int numberSpinGroups() const { return this->NJSX(); }

  /**
   *  @brief Return the particle pair information
   */
  const ParticlePairs& particlePairs() const { return this->particle_pairs_; }

  /**
   *  @brief Return the spin groups
   */
  auto spinGroups() const {

    return ranges::cpp20::views::all( this->spin_groups_ );
  }

  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/src/NC.hpp"
  #include "ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/src/print.hpp"
}